

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::getTessellationEvaluationInLayoutString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,TessPrimitiveType primType,
          SpacingMode spacing,bool usePointMode)

{
  char *pcVar1;
  bool *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  local_e0._M_string_length = 0;
  local_e0.field_2._M_local_buf[0] = '\0';
  std::operator+(&local_c0,&local_e0,"layout (");
  if ((uint)this < 3) {
    pcVar1 = (char *)(&DAT_00a0b4b0)[(ulong)this & 0xffffffff];
  }
  else {
    pcVar1 = (char *)0x0;
  }
  std::operator+(&local_a0,&local_c0,pcVar1);
  std::operator+(&local_80,&local_a0,", ");
  if (primType < TESSPRIMITIVETYPE_LAST) {
    pcVar1 = (&PTR_anon_var_dwarf_16c532_00a0b4c8)[primType];
  }
  else {
    pcVar1 = (char *)0x0;
  }
  std::operator+(&local_60,&local_80,pcVar1);
  __rhs = SSBOArrayLengthTests::init::arraysSized + 1;
  if ((char)spacing != '\0') {
    __rhs = (bool *)0x826a31;
  }
  std::operator+(&local_40,&local_60,__rhs);
  std::operator+(__return_storage_ptr__,&local_40,") in;\n");
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  return __return_storage_ptr__;
}

Assistant:

static inline string getTessellationEvaluationInLayoutString (TessPrimitiveType primType, SpacingMode spacing, bool usePointMode=false)
{
	return string() + "layout (" + getTessPrimitiveTypeShaderName(primType)
								 + ", " + getSpacingModeShaderName(spacing)
								 + (usePointMode ? ", point_mode" : "")
								 + ") in;\n";
}